

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBasePrimitiveTest_Arena_Test::TestBody
          (MapFieldBasePrimitiveTest_Arena_Test *this)

{
  CachedBlock ***this_00;
  bool bVar1;
  Map<int,_int> *this_01;
  int *piVar2;
  RepeatedPtrFieldBase *pRVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_1a8;
  Message local_1a0;
  Arena *local_198;
  Arena *local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  TestMapField *map_field_1;
  TypeDefinedMapFieldBase<int,_int> *local_120;
  MapFieldType *map_field;
  Arena arena;
  ArenaOptions options;
  allocator_type local_29;
  undefined1 local_28 [8];
  vector<char,_std::allocator<char>_> arena_block;
  MapFieldBasePrimitiveTest_Arena_Test *this_local;
  
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_28,0x20000,&local_29);
  std::allocator<char>::~allocator(&local_29);
  this_00 = &arena.impl_.first_arena_.cached_blocks_;
  ArenaOptions::ArenaOptions((ArenaOptions *)this_00);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)local_28,0);
  std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)local_28);
  Arena::Arena((Arena *)&map_field,(ArenaOptions *)this_00);
  local_120 = &Arena::
               Create<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
                         ((Arena *)&map_field)->super_TypeDefinedMapFieldBase<int,_int>;
  this_01 = TypeDefinedMapFieldBase<int,_int>::MutableMap(local_120);
  map_field_1._4_4_ = 100;
  piVar2 = Map<int,_int>::operator[]<int>(this_01,(key_arg<int> *)((long)&map_field_1 + 4));
  *piVar2 = 0x65;
  MapFieldBase::GetRepeatedField(&local_120->super_MapFieldBase);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Arena::
         Create<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
                   ((Arena *)&map_field);
  pRVar3 = MapFieldBase::MutableRepeatedField
                     ((MapFieldBase *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_141 = pRVar3 != (RepeatedPtrFieldBase *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_140,
               (AssertionResult *)"map_field->MutableRepeatedField() != nullptr","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  pRVar3 = MapFieldBase::GetRepeatedField
                     ((MapFieldBase *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  local_190 = MapFieldTestPeer::GetArena(pRVar3);
  local_198 = (Arena *)&map_field;
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_188,"MapFieldTestPeer::GetArena(map_field->GetRepeatedField())",
             "&arena",&local_190,&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
               ,0x9d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  Arena::~Arena((Arena *)&map_field);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_28)
  ;
  return;
}

Assistant:

TEST_P(MapFieldBasePrimitiveTest, Arena) {
  // Allocate a large initial block to avoid mallocs during hooked test.
  std::vector<char> arena_block(128 * 1024);
  ArenaOptions options;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena(options);

  {
    // TODO: Re-write the test to ensure the memory for the map and
    // repeated fields are allocated from arenas.
    // NoHeapChecker no_heap;

    MapFieldType* map_field = Arena::Create<MapFieldType>(&arena);

    // Set content in map
    (*map_field->MutableMap())[100] = 101;

    // Trigger conversion to repeated field.
    map_field->GetRepeatedField();
  }

  {
    // TODO: Re-write the test to ensure the memory for the map and
    // repeated fields are allocated from arenas.
    // NoHeapChecker no_heap;

    TestMapField* map_field = Arena::Create<TestMapField>(&arena);

    // Trigger conversion to repeated field.
    EXPECT_TRUE(map_field->MutableRepeatedField() != nullptr);

    EXPECT_EQ(MapFieldTestPeer::GetArena(map_field->GetRepeatedField()),
              &arena);
  }
}